

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::removeNode(MemoryLeakDetectorTable *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  uint uVar2;
  MemoryLeakDetectorNode *pMVar3;
  MemoryLeakDetectorNode *pMVar4;
  
  uVar2 = (int)memory + (int)((ulong)memory / 0x49) * -0x49;
  pMVar1 = this->table_[uVar2].head_;
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
    return (MemoryLeakDetectorNode *)0x0;
  }
  if (*(char **)(pMVar1 + 0x10) == memory) {
    pMVar3 = (MemoryLeakDetectorNode *)0x0;
  }
  else {
    do {
      pMVar3 = pMVar1;
      pMVar1 = *(MemoryLeakDetectorNode **)(pMVar3 + 0x38);
      if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
        return (MemoryLeakDetectorNode *)0x0;
      }
    } while (*(char **)(pMVar1 + 0x10) != memory);
  }
  pMVar4 = pMVar3 + 0x38;
  if (pMVar3 == (MemoryLeakDetectorNode *)0x0) {
    pMVar4 = (MemoryLeakDetectorNode *)(this->table_ + uVar2);
  }
  *(undefined8 *)pMVar4 = *(undefined8 *)(pMVar1 + 0x38);
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::removeNode(char* memory)
{
    return table_[hash(memory)].removeNode(memory);
}